

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_TestExistingSuperType_Test::TestBody
          (IsorecursiveTest_TestExistingSuperType_Test *this)

{
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar3;
  reference pvVar4;
  char *in_R9;
  Entry EVar5;
  AssertHelper local_3a8;
  Message local_3a0;
  HeapType local_398;
  HeapType local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_1;
  Message local_370;
  HeapType local_368;
  HeapType local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar;
  __uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_340;
  undefined1 local_338 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built_3;
  AssertHelper local_300;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__3;
  BuildResult result_3;
  Entry local_2b8;
  Struct local_2a8;
  TypeBuilder local_288;
  TypeBuilder builder_3;
  Type B2;
  __uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_270;
  undefined1 local_268 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built_2;
  AssertHelper local_230;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__2;
  BuildResult result_2;
  Entry local_1e8;
  Struct local_1d8;
  TypeBuilder local_1c0;
  TypeBuilder builder_2;
  Type B1;
  __uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_1a8;
  undefined1 local_1a0 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built_1;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__1;
  BuildResult result_1;
  Struct local_118;
  TypeBuilder local_f8;
  TypeBuilder builder_1;
  Type A2;
  __uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_e0;
  undefined1 local_d8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_b8;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Entry local_48;
  Struct local_38;
  TypeBuilder local_20;
  TypeBuilder builder;
  Type A1;
  IsorecursiveTest_TestExistingSuperType_Test *this_local;
  
  wasm::Type::Type((Type *)&builder);
  wasm::TypeBuilder::TypeBuilder(&local_20,1);
  local_38.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_38);
  local_48 = wasm::TypeBuilder::operator[](&local_20,0);
  wasm::TypeBuilder::Entry::operator=(&local_48,&local_38);
  wasm::Struct::~Struct(&local_38);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_88,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_88,(AssertionResult *)"result","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x3b6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(&local_90);
  }
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    pvVar3 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_d8,pvVar3);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_d8,0);
    wasm::Type::Type((Type *)&local_e0,(HeapType)pvVar4->id,Nullable);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         local_e0._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_d8);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_20);
  if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    wasm::Type::Type((Type *)&builder_1);
    wasm::TypeBuilder::TypeBuilder(&local_f8,1);
    local_118.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wasm::Struct::Struct(&local_118);
    EVar5 = wasm::TypeBuilder::operator[](&local_f8,0);
    result_1.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
         EVar5.builder;
    wasm::TypeBuilder::Entry::operator=
              ((Entry *)((long)&result_1.
                                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        + 0x18),&local_118);
    wasm::Struct::~Struct(&local_118);
    wasm::TypeBuilder::build();
    testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
              ((AssertionResult *)local_158,(BuildResult *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &built_1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_158,
                 (AssertionResult *)"result","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x3c1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      std::__cxx11::string::~string
                ((string *)
                 &built_1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_160);
    }
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
    if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      pvVar3 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__1.message_);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1a0,pvVar3);
      pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1a0,0);
      wasm::Type::Type((Type *)&local_1a8,(HeapType)pvVar4->id,Nullable);
      builder_1.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
           local_1a8._M_t.
           super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
           .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_1a0);
      built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__1.message_);
    wasm::TypeBuilder::~TypeBuilder(&local_f8);
    if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      wasm::Type::Type((Type *)&builder_2);
      wasm::TypeBuilder::TypeBuilder(&local_1c0,1);
      local_1d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      wasm::Struct::Struct(&local_1d8);
      local_1e8 = wasm::TypeBuilder::operator[](&local_1c0,0);
      wasm::TypeBuilder::Entry::operator=(&local_1e8,&local_1d8);
      wasm::Struct::~Struct(&local_1d8);
      wasm::Type::getHeapType();
      wasm::TypeBuilder::setSubType((ulong)&local_1c0,(HeapType)0x0);
      wasm::TypeBuilder::build();
      testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
                ((AssertionResult *)local_220,(BuildResult *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
      if (!bVar1) {
        testing::Message::Message(&local_228);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &built_2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_220,
                   (AssertionResult *)"result","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x3cd,pcVar2);
        testing::internal::AssertHelper::operator=(&local_230,&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        std::__cxx11::string::~string
                  ((string *)
                   &built_2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_228);
      }
      built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
      if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        pvVar3 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__2.message_);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_268,pvVar3);
        pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_268,0);
        wasm::Type::Type((Type *)&local_270,(HeapType)pvVar4->id,Nullable);
        builder_2.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
             (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
             (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
             local_270._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_268);
        built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__2.message_);
      wasm::TypeBuilder::~TypeBuilder(&local_1c0);
      if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        wasm::Type::Type((Type *)&builder_3);
        wasm::TypeBuilder::TypeBuilder(&local_288,1);
        local_2a8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        wasm::Struct::Struct(&local_2a8);
        local_2b8 = wasm::TypeBuilder::operator[](&local_288,0);
        wasm::TypeBuilder::Entry::operator=(&local_2b8,&local_2a8);
        wasm::Struct::~Struct(&local_2a8);
        wasm::Type::getHeapType();
        wasm::TypeBuilder::setSubType((ulong)&local_288,(HeapType)0x0);
        wasm::TypeBuilder::build();
        testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
                  ((AssertionResult *)local_2f0,(BuildResult *)&gtest_ar__3.message_,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
        if (!bVar1) {
          testing::Message::Message(&local_2f8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &built_3.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_2f0,
                     (AssertionResult *)"result","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_300,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x3d9,pcVar2);
          testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
          testing::internal::AssertHelper::~AssertHelper(&local_300);
          std::__cxx11::string::~string
                    ((string *)
                     &built_3.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_2f8);
        }
        built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
        if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          pvVar3 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__3.message_);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_338,pvVar3);
          pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_338,0
                             );
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )pvVar4->id;
          wasm::Type::Type((Type *)&local_340,
                           (HeapType)
                           gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,Nullable);
          builder_3.impl._M_t.
          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
               (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
               (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
               local_340._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_338);
          built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__3.message_);
        wasm::TypeBuilder::~TypeBuilder(&local_288);
        if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          local_360.id = wasm::Type::getHeapType();
          local_368.id = wasm::Type::getHeapType();
          testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                    ((EqHelper *)local_358,"A1.getHeapType()","A2.getHeapType()",&local_360,
                     &local_368);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
          if (!bVar1) {
            testing::Message::Message(&local_370);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x3df,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,&local_370);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_370);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
          local_390.id = wasm::Type::getHeapType();
          local_398.id = wasm::Type::getHeapType();
          testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                    ((EqHelper *)local_388,"B1.getHeapType()","B2.getHeapType()",&local_390,
                     &local_398);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
          if (!bVar1) {
            testing::Message::Message(&local_3a0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x3e0,pcVar2);
            testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
            testing::internal::AssertHelper::~AssertHelper(&local_3a8);
            testing::Message::~Message(&local_3a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(IsorecursiveTest, TestExistingSuperType) {
  // Build an initial type A1
  Type A1;
  {
    TypeBuilder builder(1);
    builder[0] = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A1 = Type(built[0], Nullable);
  }

  // Build a separate type A2 identical to A1
  Type A2;
  {
    TypeBuilder builder(1);
    builder[0] = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A2 = Type(built[0], Nullable);
  }

  // Build a type B1 <: A1 using a new builder
  Type B1;
  {
    TypeBuilder builder(1);
    builder[0] = Struct();
    builder.setSubType(0, A1.getHeapType());
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    B1 = Type(built[0], Nullable);
  }

  // Build a type B2 <: A2 using a new builder
  Type B2;
  {
    TypeBuilder builder(1);
    builder[0] = Struct();
    builder.setSubType(0, A2.getHeapType());
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    B2 = Type(built[0], Nullable);
  }

  // Test that A1 == A2 and B1 == B2
  EXPECT_EQ(A1.getHeapType(), A2.getHeapType());
  EXPECT_EQ(B1.getHeapType(), B2.getHeapType());
}